

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vecFlt.h
# Opt level: O2

Vec_Flt_t * Vec_FltAlloc(int nCap)

{
  Vec_Flt_t *pVVar1;
  float *pfVar2;
  int iVar3;
  
  pVVar1 = (Vec_Flt_t *)malloc(0x10);
  iVar3 = 0x10;
  if (0xe < nCap - 1U) {
    iVar3 = nCap;
  }
  pVVar1->nSize = 0;
  pVVar1->nCap = iVar3;
  if (iVar3 == 0) {
    pfVar2 = (float *)0x0;
  }
  else {
    pfVar2 = (float *)malloc((long)iVar3 << 2);
  }
  pVVar1->pArray = pfVar2;
  return pVVar1;
}

Assistant:

static inline Vec_Flt_t * Vec_FltAlloc( int nCap )
{
    Vec_Flt_t * p;
    p = ABC_ALLOC( Vec_Flt_t, 1 );
    if ( nCap > 0 && nCap < 16 )
        nCap = 16;
    p->nSize  = 0;
    p->nCap   = nCap;
    p->pArray = p->nCap? ABC_ALLOC( float, p->nCap ) : NULL;
    return p;
}